

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void addStaticRoot(object **objp)

{
  long lVar1;
  
  if (0 < (long)staticRootTop) {
    lVar1 = 0;
    do {
      if (*(object ***)((long)staticRoots + lVar1) == objp) {
        return;
      }
      lVar1 = lVar1 + 8;
    } while ((long)staticRootTop * 8 - lVar1 != 0);
  }
  if (199 < staticRootTop) {
    error_impl("addStaticRoot",0x189,
               "addStaticRoot(): too many static references (max %d) to store object %p!",200,objp);
  }
  lVar1 = (long)staticRootTop;
  staticRootTop = staticRootTop + 1;
  staticRoots[lVar1] = objp;
  return;
}

Assistant:

void addStaticRoot(struct object **objp)
{
    int i;

    for (i = 0; i < staticRootTop; ++i) {
        if (objp == staticRoots[i]) {
            return;
        }
    }
    if (staticRootTop >= STATICROOTLIMIT) {
        error("addStaticRoot(): too many static references (max %d) to store object %p!", STATICROOTLIMIT, objp);
    }
    staticRoots[staticRootTop++] = objp;
}